

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::ShaderTextureFunctionCase::initTexture(ShaderTextureFunctionCase *this)

{
  pointer *ppTVar1;
  Function FVar2;
  pointer pPVar3;
  int i;
  int iVar4;
  int iVar5;
  Texture2D *this_00;
  Texture2DArray *this_01;
  iterator __position;
  long lVar6;
  Texture3D *this_02;
  long lVar7;
  TextureCube *this_03;
  int i_18;
  int iVar8;
  int iVar9;
  long lVar10;
  IVec4 *pIVar11;
  int iVar12;
  float *pfVar13;
  int iVar14;
  int face;
  bool bVar15;
  bool bVar16;
  byte bVar17;
  float fVar18;
  float fVar19;
  CubeFaceFloatCoords CVar20;
  CubeFaceFloatCoords CVar21;
  CubeFaceFloatCoords CVar22;
  Vector<float,_4> res_3;
  Vec4 colorB_2;
  float local_164;
  Vec2 f;
  Vec4 colorB;
  IVec2 viewportSize;
  Vec4 cBias;
  undefined1 local_120 [8];
  Vec4 colorB_3;
  Vec4 colorA;
  undefined4 local_f8;
  float afStack_f4 [15];
  Vec4 cScale;
  float local_88 [4];
  TextureFormatInfo fmtInfo;
  TextureFormat texFmt;
  
  bVar17 = 0;
  if (initTexture()::texCubeSwz == '\0') {
    initTexture();
  }
  texFmt = glu::mapGLInternalFormat((this->m_textureSpec).format);
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  deqp::gls::ShaderRenderCase::getViewportSize((ShaderRenderCase *)&viewportSize);
  FVar2 = (this->m_lookupSpec).function;
  bVar16 = (this->super_ShaderRenderCase).m_isVertexCase != false;
  bVar15 = FUNCTION_TEXTUREPROJ3 < FVar2;
  if (((byte)(0x1b6 >> ((byte)FVar2 & 0x1f)) & FVar2 < FUNCTION_TEXELFETCH) == 1) {
    fVar18 = 1.0 / (this->m_lookupSpec).minCoord.m_data[FVar2 == FUNCTION_TEXTUREPROJ3 ^ 3];
  }
  else {
    fVar18 = 1.0;
  }
  switch((this->m_textureSpec).type) {
  case TEXTURETYPE_2D:
    fVar19 = 0.0;
    if (bVar15 || bVar16) {
      iVar4 = (this->m_textureSpec).numLevels + -1;
      iVar12 = 1;
      if (1 < iVar4) {
        iVar12 = iVar4;
      }
      fVar19 = 1.0 / (float)iVar12;
    }
    cScale.m_data[0] = 0.0;
    cScale.m_data[1] = 0.0;
    cScale.m_data[2] = 0.0;
    cScale.m_data[3] = 0.0;
    lVar6 = 0;
    do {
      cScale.m_data[lVar6] = fmtInfo.valueMax.m_data[lVar6] - fmtInfo.valueMin.m_data[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    cBias.m_data[0] = fmtInfo.valueMin.m_data[0];
    cBias.m_data[1] = fmtInfo.valueMin.m_data[1];
    cBias.m_data[2] = fmtInfo.valueMin.m_data[2];
    cBias.m_data[3] = fmtInfo.valueMin.m_data[3];
    iVar12 = (this->m_textureSpec).width;
    iVar4 = (this->m_textureSpec).height;
    iVar9 = iVar12 + 3;
    if (-1 < iVar12) {
      iVar9 = iVar12;
    }
    iVar5 = iVar4 + 3;
    if (-1 < iVar4) {
      iVar5 = iVar4;
    }
    iVar14 = iVar5 >> 2;
    if (iVar9 >> 2 < iVar5 >> 2) {
      iVar14 = iVar9 >> 2;
    }
    this_00 = (Texture2D *)operator_new(0x70);
    glu::Texture2D::Texture2D
              (this_00,(this->super_ShaderRenderCase).m_renderCtx,(this->m_textureSpec).format,
               iVar12,iVar4);
    this->m_texture2D = this_00;
    if (0 < (this->m_textureSpec).numLevels) {
      lVar6 = 0;
      do {
        res_3.m_data[0] = (float)(int)lVar6 * fVar19;
        res_3.m_data[1] = 1.0 - res_3.m_data[0];
        res_3.m_data[3] = res_3.m_data[1];
        res_3.m_data[2] = res_3.m_data[0];
        colorB.m_data[0] = 0.0;
        colorB.m_data[1] = 0.0;
        colorB.m_data[2] = 0.0;
        colorB.m_data[3] = 0.0;
        lVar7 = 0;
        do {
          colorB.m_data[lVar7] = cScale.m_data[lVar7] * res_3.m_data[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        colorA.m_data[0] = 0.0;
        colorA.m_data[1] = 0.0;
        colorA.m_data[2] = 0.0;
        colorA.m_data[3] = 0.0;
        lVar7 = 0;
        do {
          colorA.m_data[lVar7] = cBias.m_data[lVar7] + colorB.m_data[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        colorB_2.m_data[1] = res_3.m_data[0];
        colorB_2.m_data[0] = res_3.m_data[1];
        colorB_2.m_data[3] = res_3.m_data[0];
        colorB_2.m_data[2] = res_3.m_data[1];
        res_3.m_data[0] = 0.0;
        res_3.m_data[1] = 0.0;
        res_3.m_data[2] = 0.0;
        res_3.m_data[3] = 0.0;
        lVar7 = 0;
        do {
          res_3.m_data[lVar7] = cScale.m_data[lVar7] * colorB_2.m_data[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        colorB.m_data[0] = 0.0;
        colorB.m_data[1] = 0.0;
        colorB.m_data[2] = 0.0;
        colorB.m_data[3] = 0.0;
        lVar7 = 0;
        do {
          colorB.m_data[lVar7] = cBias.m_data[lVar7] + res_3.m_data[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        tcu::Texture2D::allocLevel(&this->m_texture2D->m_refTexture,(int)lVar6);
        iVar12 = iVar14 >> ((byte)lVar6 & 0x1f);
        if (iVar12 < 2) {
          iVar12 = 1;
        }
        tcu::fillWithGrid((this->m_texture2D->m_refTexture).super_TextureLevelPyramid.m_access.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar6,iVar12,&colorA,&colorB);
        lVar6 = lVar6 + 1;
      } while (lVar6 < (this->m_textureSpec).numLevels);
    }
    (*this->m_texture2D->_vptr_Texture2D[2])();
    fVar18 = glu::TextureTestUtil::computeLodFromDerivates
                       (LODMODE_EXACT,
                        ((float)(this->m_textureSpec).width *
                        ((this->m_lookupSpec).maxCoord.m_data[0] -
                        (this->m_lookupSpec).minCoord.m_data[0]) * fVar18) /
                        (float)viewportSize.m_data[0],0.0,0.0,
                        ((float)(this->m_textureSpec).height *
                        ((this->m_lookupSpec).maxCoord.m_data[1] -
                        (this->m_lookupSpec).minCoord.m_data[1]) * fVar18) /
                        (float)viewportSize.m_data[1]);
    (this->m_lookupParams).lod = fVar18;
    deqp::gls::TextureBinding::TextureBinding
              ((TextureBinding *)&colorA,this->m_texture2D,&(this->m_textureSpec).sampler);
    break;
  case TEXTURETYPE_CUBE_MAP:
    fVar19 = 0.0;
    if (bVar15 || bVar16) {
      iVar4 = (this->m_textureSpec).numLevels + -1;
      iVar12 = 1;
      if (1 < iVar4) {
        iVar12 = iVar4;
      }
      fVar19 = 1.0 / (float)iVar12;
    }
    cScale.m_data[0] = 0.0;
    cScale.m_data[1] = 0.0;
    cScale.m_data[2] = 0.0;
    cScale.m_data[3] = 0.0;
    lVar6 = 0;
    do {
      cScale.m_data[lVar6] = fmtInfo.valueMax.m_data[lVar6] - fmtInfo.valueMin.m_data[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    cBias.m_data[0] = fmtInfo.valueMin.m_data[0];
    cBias.m_data[1] = fmtInfo.valueMin.m_data[1];
    cBias.m_data[2] = fmtInfo.valueMin.m_data[2];
    cBias.m_data[3] = fmtInfo.valueMin.m_data[3];
    colorA.m_data[0] = 0.0;
    colorA.m_data[1] = 0.0;
    colorA.m_data[2] = 0.0;
    colorA.m_data[3] = 0.0;
    lVar6 = 0;
    do {
      colorA.m_data[lVar6] = cScale.m_data[lVar6] * 0.5;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    colorB.m_data[0] = 0.0;
    colorB.m_data[1] = 0.0;
    colorB.m_data[2] = 0.0;
    colorB.m_data[3] = 0.0;
    lVar6 = 0;
    do {
      colorB.m_data[lVar6] = cBias.m_data[lVar6] + colorA.m_data[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    iVar12 = (this->m_textureSpec).width;
    iVar4 = (this->m_textureSpec).height;
    iVar9 = iVar12 + 3;
    if (-1 < iVar12) {
      iVar9 = iVar12;
    }
    iVar5 = iVar4 + 3;
    if (-1 < iVar4) {
      iVar5 = iVar4;
    }
    iVar4 = iVar5 >> 2;
    if (iVar9 >> 2 < iVar5 >> 2) {
      iVar4 = iVar9 >> 2;
    }
    this_03 = (TextureCube *)operator_new(0x180);
    glu::TextureCube::TextureCube
              (this_03,(this->super_ShaderRenderCase).m_renderCtx,(this->m_textureSpec).format,
               iVar12);
    this->m_textureCube = this_03;
    if (0 < (this->m_textureSpec).numLevels) {
      local_120 = (undefined1  [8])0x0;
      lVar6 = 0;
      do {
        f.m_data[0] = (float)(int)lVar6 * fVar19;
        f.m_data[1] = 1.0 - f.m_data[0];
        iVar12 = iVar4 >> ((byte)lVar6 & 0x1f);
        if (iVar12 < 2) {
          iVar12 = 1;
        }
        pIVar11 = initTexture::texCubeSwz;
        lVar7 = 0;
        do {
          res_3.m_data[0] = 0.0;
          res_3.m_data[1] = 0.0;
          res_3.m_data[2] = 0.0;
          res_3.m_data[3] = 0.0;
          lVar10 = 0;
          do {
            res_3.m_data[lVar10] = (float)(1 - pIVar11->m_data[lVar10]);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          colorB_3.m_data[1] = f.m_data[initTexture::texCubeSwz[lVar7].m_data[1]];
          colorB_3.m_data[0] = f.m_data[initTexture::texCubeSwz[lVar7].m_data[0]];
          colorB_3.m_data[3] = f.m_data[initTexture::texCubeSwz[lVar7].m_data[3]];
          colorB_3.m_data[2] = f.m_data[initTexture::texCubeSwz[lVar7].m_data[2]];
          colorA.m_data[0] = 0.0;
          colorA.m_data[1] = 0.0;
          colorA.m_data[2] = 0.0;
          colorA.m_data[3] = 0.0;
          lVar10 = 0;
          do {
            colorA.m_data[lVar10] = cScale.m_data[lVar10] * colorB_3.m_data[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          colorB_2.m_data[0] = 0.0;
          colorB_2.m_data[1] = 0.0;
          colorB_2.m_data[2] = 0.0;
          colorB_2.m_data[3] = 0.0;
          lVar10 = 0;
          do {
            colorB_2.m_data[lVar10] = cBias.m_data[lVar10] + colorA.m_data[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          local_88[0] = f.m_data[(int)res_3.m_data[0]];
          local_88[1] = f.m_data[(int)res_3.m_data[1]];
          local_88[2] = f.m_data[(int)res_3.m_data[2]];
          local_88[3] = f.m_data[(int)res_3.m_data[3]];
          colorA.m_data[0] = 0.0;
          colorA.m_data[1] = 0.0;
          colorA.m_data[2] = 0.0;
          colorA.m_data[3] = 0.0;
          lVar10 = 0;
          do {
            colorA.m_data[lVar10] = cScale.m_data[lVar10] * local_88[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          colorB_3.m_data[0] = 0.0;
          colorB_3.m_data[1] = 0.0;
          colorB_3.m_data[2] = 0.0;
          colorB_3.m_data[3] = 0.0;
          lVar10 = 0;
          do {
            colorB_3.m_data[lVar10] = cBias.m_data[lVar10] + colorA.m_data[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          tcu::TextureCube::allocLevel
                    (&this->m_textureCube->m_refTexture,(CubeFace)lVar7,(int)lVar6);
          pPVar3 = (this->m_textureCube->m_refTexture).m_access[lVar7].
                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          colorA.m_data._0_8_ = pPVar3[lVar6].super_ConstPixelBufferAccess.m_format;
          lVar10 = 2;
          do {
            colorA.m_data[lVar10] =
                 *(float *)((long)(pPVar3->super_ConstPixelBufferAccess).m_size.m_data +
                           lVar10 * 4 + (long)local_120 + -8);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 5);
          lVar10 = 5;
          do {
            colorA.m_data[lVar10] =
                 *(float *)((long)(pPVar3->super_ConstPixelBufferAccess).m_size.m_data +
                           lVar10 * 4 + (long)local_120 + -8);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 8);
          iVar9 = (int)colorA.m_data[2] + -1;
          tcu::fillWithGrid((PixelBufferAccess *)&colorA,iVar12,&colorB_2,&colorB_3);
          tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&colorA,&colorB,0,0,0);
          tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&colorA,&colorB,0,iVar9,0);
          tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&colorA,&colorB,iVar9,0,0);
          tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&colorA,&colorB,iVar9,iVar9,0);
          lVar7 = lVar7 + 1;
          pIVar11 = pIVar11 + 1;
        } while (lVar7 != 6);
        lVar6 = lVar6 + 1;
        local_120 = (undefined1  [8])((long)local_120 + 0x28);
      } while (lVar6 < (this->m_textureSpec).numLevels);
    }
    glu::TextureCube::upload(this->m_textureCube);
    colorA.m_data[1] = (this->m_lookupSpec).minCoord.m_data[1] * fVar18;
    colorA.m_data[0] = (this->m_lookupSpec).minCoord.m_data[0] * fVar18;
    colorA.m_data[2] = (this->m_lookupSpec).minCoord.m_data[2] * fVar18;
    CVar20 = tcu::getCubeFaceCoords((Vec3 *)&colorA);
    colorA.m_data[2] = (this->m_lookupSpec).minCoord.m_data[2] * fVar18;
    colorA.m_data[1] = (this->m_lookupSpec).minCoord.m_data[1] * fVar18;
    colorA.m_data[0] = (this->m_lookupSpec).maxCoord.m_data[0] * fVar18;
    CVar21 = tcu::getCubeFaceCoords((Vec3 *)&colorA);
    colorA.m_data[1] = (this->m_lookupSpec).maxCoord.m_data[1] * fVar18;
    colorA.m_data[0] = (this->m_lookupSpec).minCoord.m_data[0] * fVar18;
    colorA.m_data[2] = fVar18 * (this->m_lookupSpec).minCoord.m_data[2];
    CVar22 = tcu::getCubeFaceCoords((Vec3 *)&colorA);
    fVar18 = glu::TextureTestUtil::computeLodFromDerivates
                       (LODMODE_EXACT,
                        ((float)(this->m_textureSpec).width * (CVar21.s - CVar20.s)) /
                        (float)viewportSize.m_data[0],0.0,0.0,
                        ((float)(this->m_textureSpec).height * (CVar22.t - CVar20.t)) /
                        (float)viewportSize.m_data[1]);
    (this->m_lookupParams).lod = fVar18;
    deqp::gls::TextureBinding::TextureBinding
              ((TextureBinding *)&colorA,this->m_textureCube,&(this->m_textureSpec).sampler);
    break;
  case TEXTURETYPE_2D_ARRAY:
    iVar12 = (this->m_textureSpec).depth;
    local_164 = 0.0;
    if (bVar15 || bVar16) {
      iVar9 = (this->m_textureSpec).numLevels + -1;
      iVar4 = 1;
      if (1 < iVar9) {
        iVar4 = iVar9;
      }
      local_164 = 1.0 / (float)(iVar4 * iVar12);
    }
    cBias.m_data[0] = 0.0;
    cBias.m_data[1] = 0.0;
    cBias.m_data[2] = 0.0;
    cBias.m_data[3] = 0.0;
    lVar6 = 0;
    do {
      cBias.m_data[lVar6] = fmtInfo.valueMax.m_data[lVar6] - fmtInfo.valueMin.m_data[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    colorB.m_data[0] = fmtInfo.valueMin.m_data[0];
    colorB.m_data[1] = fmtInfo.valueMin.m_data[1];
    colorB.m_data[2] = fmtInfo.valueMin.m_data[2];
    colorB.m_data[3] = fmtInfo.valueMin.m_data[3];
    iVar4 = (this->m_textureSpec).width;
    iVar9 = (this->m_textureSpec).height;
    iVar5 = iVar4 + 3;
    if (-1 < iVar4) {
      iVar5 = iVar4;
    }
    iVar14 = iVar9 + 3;
    if (-1 < iVar9) {
      iVar14 = iVar9;
    }
    iVar8 = iVar14 >> 2;
    if (iVar5 >> 2 < iVar14 >> 2) {
      iVar8 = iVar5 >> 2;
    }
    this_01 = (Texture2DArray *)operator_new(0x70);
    glu::Texture2DArray::Texture2DArray
              (this_01,(this->super_ShaderRenderCase).m_renderCtx,(this->m_textureSpec).format,iVar4
               ,iVar9,iVar12);
    this->m_texture2DArray = this_01;
    if (0 < (this->m_textureSpec).numLevels) {
      lVar6 = 0;
      lVar7 = 0;
      do {
        tcu::Texture2DArray::allocLevel(&this->m_texture2DArray->m_refTexture,(int)lVar7);
        pPVar3 = (this->m_texture2DArray->m_refTexture).super_TextureLevelPyramid.m_access.
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        colorA.m_data[0] = (float)pPVar3[lVar7].super_ConstPixelBufferAccess.m_format.order;
        colorA.m_data[1] = (float)pPVar3[lVar7].super_ConstPixelBufferAccess.m_format.type;
        lVar10 = 2;
        do {
          colorA.m_data[lVar10] =
               *(float *)((long)(pPVar3->super_ConstPixelBufferAccess).m_size.m_data +
                         lVar10 * 4 + lVar6 + -8);
          lVar10 = lVar10 + 1;
        } while (lVar10 != 5);
        lVar10 = 5;
        do {
          colorA.m_data[lVar10] =
               *(float *)((long)(pPVar3->super_ConstPixelBufferAccess).m_size.m_data +
                         lVar10 * 4 + lVar6 + -8);
          lVar10 = lVar10 + 1;
        } while (lVar10 != 8);
        if (0 < (int)local_f8) {
          iVar4 = iVar8 >> ((byte)lVar7 & 0x1f);
          if (iVar4 < 2) {
            iVar4 = 1;
          }
          iVar9 = 0;
          do {
            colorB_2.m_data[0] =
                 (float)iVar9 * (1.0 / (float)iVar12) + (float)(int)lVar7 * local_164;
            colorB_2.m_data[1] = 1.0 - colorB_2.m_data[0];
            colorB_2.m_data[3] = colorB_2.m_data[1];
            colorB_2.m_data[2] = colorB_2.m_data[0];
            cScale.m_data[0] = 0.0;
            cScale.m_data[1] = 0.0;
            cScale.m_data[2] = 0.0;
            cScale.m_data[3] = 0.0;
            lVar10 = 0;
            do {
              cScale.m_data[lVar10] = cBias.m_data[lVar10] * colorB_2.m_data[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            res_3.m_data[0] = 0.0;
            res_3.m_data[1] = 0.0;
            res_3.m_data[2] = 0.0;
            res_3.m_data[3] = 0.0;
            lVar10 = 0;
            do {
              res_3.m_data[lVar10] = colorB.m_data[lVar10] + cScale.m_data[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            colorB_3.m_data[1] = colorB_2.m_data[0];
            colorB_3.m_data[0] = colorB_2.m_data[1];
            colorB_3.m_data[3] = colorB_2.m_data[0];
            colorB_3.m_data[2] = colorB_2.m_data[1];
            cScale.m_data[0] = 0.0;
            cScale.m_data[1] = 0.0;
            cScale.m_data[2] = 0.0;
            cScale.m_data[3] = 0.0;
            lVar10 = 0;
            do {
              cScale.m_data[lVar10] = cBias.m_data[lVar10] * colorB_3.m_data[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            colorB_2.m_data[0] = 0.0;
            colorB_2.m_data[1] = 0.0;
            colorB_2.m_data[2] = 0.0;
            colorB_2.m_data[3] = 0.0;
            lVar10 = 0;
            do {
              colorB_2.m_data[lVar10] = colorB.m_data[lVar10] + cScale.m_data[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            tcu::getSubregion((PixelBufferAccess *)&cScale,(PixelBufferAccess *)&colorA,0,0,iVar9,
                              (int)colorA.m_data[2],(int)colorA.m_data[3],1);
            tcu::fillWithGrid((PixelBufferAccess *)&cScale,iVar4,&res_3,&colorB_2);
            iVar9 = iVar9 + 1;
          } while (iVar9 < (int)local_f8);
        }
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x28;
      } while (lVar7 < (this->m_textureSpec).numLevels);
    }
    glu::Texture2DArray::upload(this->m_texture2DArray);
    fVar18 = glu::TextureTestUtil::computeLodFromDerivates
                       (LODMODE_EXACT,
                        ((float)(this->m_textureSpec).width *
                        ((this->m_lookupSpec).maxCoord.m_data[0] -
                        (this->m_lookupSpec).minCoord.m_data[0]) * fVar18) /
                        (float)viewportSize.m_data[0],0.0,0.0,
                        ((float)(this->m_textureSpec).height *
                        ((this->m_lookupSpec).maxCoord.m_data[1] -
                        (this->m_lookupSpec).minCoord.m_data[1]) * fVar18) /
                        (float)viewportSize.m_data[1]);
    (this->m_lookupParams).lod = fVar18;
    deqp::gls::TextureBinding::TextureBinding
              ((TextureBinding *)&colorA,this->m_texture2DArray,&(this->m_textureSpec).sampler);
    __position._M_current =
         (this->super_ShaderRenderCase).m_textures.
         super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->super_ShaderRenderCase).m_textures.
        super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_004f7354;
    goto LAB_004f7c78;
  case TEXTURETYPE_3D:
    fVar19 = 0.0;
    if (bVar15 || bVar16) {
      iVar4 = (this->m_textureSpec).numLevels + -1;
      iVar12 = 1;
      if (1 < iVar4) {
        iVar12 = iVar4;
      }
      fVar19 = 1.0 / (float)iVar12;
    }
    cScale.m_data[0] = 0.0;
    cScale.m_data[1] = 0.0;
    cScale.m_data[2] = 0.0;
    cScale.m_data[3] = 0.0;
    lVar6 = 0;
    do {
      cScale.m_data[lVar6] = fmtInfo.valueMax.m_data[lVar6] - fmtInfo.valueMin.m_data[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    cBias.m_data[0] = fmtInfo.valueMin.m_data[0];
    cBias.m_data[1] = fmtInfo.valueMin.m_data[1];
    cBias.m_data[2] = fmtInfo.valueMin.m_data[2];
    cBias.m_data[3] = fmtInfo.valueMin.m_data[3];
    iVar12 = (this->m_textureSpec).width;
    iVar4 = (this->m_textureSpec).height;
    iVar5 = iVar12 / 2;
    iVar9 = iVar4 / 2;
    if (iVar5 < iVar9) {
      iVar9 = iVar5;
    }
    iVar5 = (this->m_textureSpec).depth;
    iVar14 = iVar5 / 2;
    if (iVar9 < iVar14) {
      iVar14 = iVar9;
    }
    this_02 = (Texture3D *)operator_new(0x70);
    glu::Texture3D::Texture3D
              (this_02,(this->super_ShaderRenderCase).m_renderCtx,(this->m_textureSpec).format,
               iVar12,iVar4,iVar5);
    this->m_texture3D = this_02;
    if (0 < (this->m_textureSpec).numLevels) {
      lVar6 = 0;
      do {
        res_3.m_data[0] = (float)(int)lVar6 * fVar19;
        res_3.m_data[1] = 1.0 - res_3.m_data[0];
        res_3.m_data[3] = res_3.m_data[1];
        res_3.m_data[2] = res_3.m_data[0];
        colorB.m_data[0] = 0.0;
        colorB.m_data[1] = 0.0;
        colorB.m_data[2] = 0.0;
        colorB.m_data[3] = 0.0;
        lVar7 = 0;
        do {
          colorB.m_data[lVar7] = cScale.m_data[lVar7] * res_3.m_data[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        colorA.m_data[0] = 0.0;
        colorA.m_data[1] = 0.0;
        colorA.m_data[2] = 0.0;
        colorA.m_data[3] = 0.0;
        lVar7 = 0;
        do {
          colorA.m_data[lVar7] = cBias.m_data[lVar7] + colorB.m_data[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        colorB_2.m_data[1] = res_3.m_data[0];
        colorB_2.m_data[0] = res_3.m_data[1];
        colorB_2.m_data[3] = res_3.m_data[0];
        colorB_2.m_data[2] = res_3.m_data[1];
        res_3.m_data[0] = 0.0;
        res_3.m_data[1] = 0.0;
        res_3.m_data[2] = 0.0;
        res_3.m_data[3] = 0.0;
        lVar7 = 0;
        do {
          res_3.m_data[lVar7] = cScale.m_data[lVar7] * colorB_2.m_data[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        colorB.m_data[0] = 0.0;
        colorB.m_data[1] = 0.0;
        colorB.m_data[2] = 0.0;
        colorB.m_data[3] = 0.0;
        lVar7 = 0;
        do {
          colorB.m_data[lVar7] = cBias.m_data[lVar7] + res_3.m_data[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        tcu::Texture3D::allocLevel(&this->m_texture3D->m_refTexture,(int)lVar6);
        iVar12 = iVar14 >> ((byte)lVar6 & 0x1f);
        if (iVar12 < 2) {
          iVar12 = 1;
        }
        tcu::fillWithGrid((this->m_texture3D->m_refTexture).super_TextureLevelPyramid.m_access.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar6,iVar12,&colorA,&colorB);
        lVar6 = lVar6 + 1;
      } while (lVar6 < (this->m_textureSpec).numLevels);
    }
    glu::Texture3D::upload(this->m_texture3D);
    fVar19 = (float)(this->m_textureSpec).depth *
             ((this->m_lookupSpec).maxCoord.m_data[2] - (this->m_lookupSpec).minCoord.m_data[2]) *
             0.5 * fVar18;
    fVar18 = glu::TextureTestUtil::computeLodFromDerivates
                       (LODMODE_EXACT,
                        ((float)(this->m_textureSpec).width *
                        ((this->m_lookupSpec).maxCoord.m_data[0] -
                        (this->m_lookupSpec).minCoord.m_data[0]) * fVar18) /
                        (float)viewportSize.m_data[0],0.0,fVar19 / (float)viewportSize.m_data[0],0.0
                        ,((float)(this->m_textureSpec).height *
                         ((this->m_lookupSpec).maxCoord.m_data[1] -
                         (this->m_lookupSpec).minCoord.m_data[1]) * fVar18) /
                         (float)viewportSize.m_data[1],fVar19 / (float)viewportSize.m_data[1]);
    (this->m_lookupParams).lod = fVar18;
    deqp::gls::TextureBinding::TextureBinding
              ((TextureBinding *)&colorA,this->m_texture3D,&(this->m_textureSpec).sampler);
    break;
  default:
    goto switchD_004f6c6b_default;
  }
  __position._M_current =
       (this->super_ShaderRenderCase).m_textures.
       super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->super_ShaderRenderCase).m_textures.
      super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_004f7354:
    std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::
    _M_realloc_insert<deqp::gls::TextureBinding>
              (&(this->super_ShaderRenderCase).m_textures,__position,(TextureBinding *)&colorA);
  }
  else {
LAB_004f7c78:
    lVar6 = 9;
    pfVar13 = colorA.m_data;
    for (; lVar6 != 0; lVar6 = lVar6 + -1) {
      fVar18 = pfVar13[1];
      (__position._M_current)->m_type = (Type)pfVar13[0];
      ((__position._M_current)->m_sampler).wrapS = (WrapMode)fVar18;
      pfVar13 = pfVar13 + (ulong)bVar17 * 0xfffffffffffffffc + 2;
      __position._M_current = __position._M_current + (ulong)bVar17 * -0x10 + 8;
    }
    ppTVar1 = &(this->super_ShaderRenderCase).m_textures.
               super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
switchD_004f6c6b_default:
  *(undefined8 *)(this->m_lookupParams).scale.m_data = fmtInfo.lookupScale.m_data._0_8_;
  *(undefined8 *)((this->m_lookupParams).scale.m_data + 2) = fmtInfo.lookupScale.m_data._8_8_;
  *(undefined8 *)(this->m_lookupParams).bias.m_data = fmtInfo.lookupBias.m_data._0_8_;
  *(undefined8 *)((this->m_lookupParams).bias.m_data + 2) = fmtInfo.lookupBias.m_data._8_8_;
  *(undefined8 *)(this->m_lookupParams).offset.m_data =
       *(undefined8 *)(this->m_lookupSpec).offset.m_data;
  (this->m_lookupParams).offset.m_data[2] = (this->m_lookupSpec).offset.m_data[2];
  return;
}

Assistant:

void ShaderTextureFunctionCase::initTexture (void)
{
	static const IVec4 texCubeSwz[] =
	{
		IVec4(0,0,1,1),
		IVec4(1,1,0,0),
		IVec4(0,1,0,1),
		IVec4(1,0,1,0),
		IVec4(0,1,1,0),
		IVec4(1,0,0,1)
	};
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(texCubeSwz) == tcu::CUBEFACE_LAST);

	tcu::TextureFormat		texFmt			= glu::mapGLInternalFormat(m_textureSpec.format);
	tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	tcu::IVec2				viewportSize	= getViewportSize();
	bool					isProj			= functionHasProj(m_lookupSpec.function);
	bool					isAutoLod		= functionHasAutoLod(m_isVertexCase ? glu::SHADERTYPE_VERTEX : glu::SHADERTYPE_FRAGMENT,
																 m_lookupSpec.function); // LOD can vary significantly
	float					proj			= isProj ? 1.0f/m_lookupSpec.minCoord[m_lookupSpec.function == FUNCTION_TEXTUREPROJ3 ? 2 : 3] : 1.0f;

	switch (m_textureSpec.type)
	{
		case TEXTURETYPE_2D:
		{
			float	levelStep		= isAutoLod ? 0.0f : 1.0f / (float)de::max(1, m_textureSpec.numLevels-1);
			Vec4	cScale			= fmtInfo.valueMax-fmtInfo.valueMin;
			Vec4	cBias			= fmtInfo.valueMin;
			int		baseCellSize	= de::min(m_textureSpec.width/4, m_textureSpec.height/4);

			m_texture2D = new glu::Texture2D(m_renderCtx, m_textureSpec.format, m_textureSpec.width, m_textureSpec.height);
			for (int level = 0; level < m_textureSpec.numLevels; level++)
			{
				float	fA		= float(level)*levelStep;
				float	fB		= 1.0f-fA;
				Vec4	colorA	= cBias + cScale*Vec4(fA, fB, fA, fB);
				Vec4	colorB	= cBias + cScale*Vec4(fB, fA, fB, fA);

				m_texture2D->getRefTexture().allocLevel(level);
				tcu::fillWithGrid(m_texture2D->getRefTexture().getLevel(level), de::max(1, baseCellSize>>level), colorA, colorB);
			}
			m_texture2D->upload();

			// Compute LOD.
			float dudx = (m_lookupSpec.maxCoord[0]-m_lookupSpec.minCoord[0])*proj*(float)m_textureSpec.width	/ (float)viewportSize[0];
			float dvdy = (m_lookupSpec.maxCoord[1]-m_lookupSpec.minCoord[1])*proj*(float)m_textureSpec.height	/ (float)viewportSize[1];
			m_lookupParams.lod = computeLodFromDerivates(DEFAULT_LOD_MODE, dudx, 0.0f, 0.0f, dvdy);

			// Append to texture list.
			m_textures.push_back(gls::TextureBinding(m_texture2D, m_textureSpec.sampler));
			break;
		}

		case TEXTURETYPE_CUBE_MAP:
		{
			float	levelStep		= isAutoLod ? 0.0f : 1.0f / (float)de::max(1, m_textureSpec.numLevels-1);
			Vec4	cScale			= fmtInfo.valueMax-fmtInfo.valueMin;
			Vec4	cBias			= fmtInfo.valueMin;
			Vec4	cCorner			= cBias + cScale*0.5f;
			int		baseCellSize	= de::min(m_textureSpec.width/4, m_textureSpec.height/4);

			DE_ASSERT(m_textureSpec.width == m_textureSpec.height);
			m_textureCube = new glu::TextureCube(m_renderCtx, m_textureSpec.format, m_textureSpec.width);
			for (int level = 0; level < m_textureSpec.numLevels; level++)
			{
				float	fA		= float(level)*levelStep;
				float	fB		= 1.0f-fA;
				Vec2	f		(fA, fB);

				for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				{
					const IVec4&	swzA	= texCubeSwz[face];
					IVec4			swzB	= 1-swzA;
					Vec4			colorA	= cBias + cScale*f.swizzle(swzA[0], swzA[1], swzA[2], swzA[3]);
					Vec4			colorB	= cBias + cScale*f.swizzle(swzB[0], swzB[1], swzB[2], swzB[3]);

					m_textureCube->getRefTexture().allocLevel((tcu::CubeFace)face, level);

					{
						const tcu::PixelBufferAccess	access		= m_textureCube->getRefTexture().getLevelFace(level, (tcu::CubeFace)face);
						const int						lastPix		= access.getWidth()-1;

						tcu::fillWithGrid(access, de::max(1, baseCellSize>>level), colorA, colorB);

						// Ensure all corners have identical colors in order to avoid dealing with ambiguous corner texel filtering
						access.setPixel(cCorner, 0, 0);
						access.setPixel(cCorner, 0, lastPix);
						access.setPixel(cCorner, lastPix, 0);
						access.setPixel(cCorner, lastPix, lastPix);
					}
				}
			}
			m_textureCube->upload();

			// Compute LOD \note Assumes that only single side is accessed and R is constant major axis.
			DE_ASSERT(de::abs(m_lookupSpec.minCoord[2] - m_lookupSpec.maxCoord[2]) < 0.005);
			DE_ASSERT(de::abs(m_lookupSpec.minCoord[0]) < de::abs(m_lookupSpec.minCoord[2]) && de::abs(m_lookupSpec.maxCoord[0]) < de::abs(m_lookupSpec.minCoord[2]));
			DE_ASSERT(de::abs(m_lookupSpec.minCoord[1]) < de::abs(m_lookupSpec.minCoord[2]) && de::abs(m_lookupSpec.maxCoord[1]) < de::abs(m_lookupSpec.minCoord[2]));

			tcu::CubeFaceFloatCoords	c00		= tcu::getCubeFaceCoords(Vec3(m_lookupSpec.minCoord[0]*proj, m_lookupSpec.minCoord[1]*proj, m_lookupSpec.minCoord[2]*proj));
			tcu::CubeFaceFloatCoords	c10		= tcu::getCubeFaceCoords(Vec3(m_lookupSpec.maxCoord[0]*proj, m_lookupSpec.minCoord[1]*proj, m_lookupSpec.minCoord[2]*proj));
			tcu::CubeFaceFloatCoords	c01		= tcu::getCubeFaceCoords(Vec3(m_lookupSpec.minCoord[0]*proj, m_lookupSpec.maxCoord[1]*proj, m_lookupSpec.minCoord[2]*proj));
			float						dudx	= (c10.s - c00.s)*(float)m_textureSpec.width	/ (float)viewportSize[0];
			float						dvdy	= (c01.t - c00.t)*(float)m_textureSpec.height	/ (float)viewportSize[1];

			m_lookupParams.lod = computeLodFromDerivates(DEFAULT_LOD_MODE, dudx, 0.0f, 0.0f, dvdy);

			m_textures.push_back(gls::TextureBinding(m_textureCube, m_textureSpec.sampler));
			break;
		}

		case TEXTURETYPE_2D_ARRAY:
		{
			float	layerStep		= 1.0f / (float)m_textureSpec.depth;
			float	levelStep		= isAutoLod ? 0.0f : 1.0f / (float)(de::max(1, m_textureSpec.numLevels-1)*m_textureSpec.depth);
			Vec4	cScale			= fmtInfo.valueMax-fmtInfo.valueMin;
			Vec4	cBias			= fmtInfo.valueMin;
			int		baseCellSize	= de::min(m_textureSpec.width/4, m_textureSpec.height/4);

			m_texture2DArray = new glu::Texture2DArray(m_renderCtx, m_textureSpec.format, m_textureSpec.width, m_textureSpec.height, m_textureSpec.depth);
			for (int level = 0; level < m_textureSpec.numLevels; level++)
			{
				m_texture2DArray->getRefTexture().allocLevel(level);
				tcu::PixelBufferAccess levelAccess = m_texture2DArray->getRefTexture().getLevel(level);

				for (int layer = 0; layer < levelAccess.getDepth(); layer++)
				{
					float	fA		= (float)layer*layerStep + (float)level*levelStep;
					float	fB		= 1.0f-fA;
					Vec4	colorA	= cBias + cScale*Vec4(fA, fB, fA, fB);
					Vec4	colorB	= cBias + cScale*Vec4(fB, fA, fB, fA);

					tcu::fillWithGrid(tcu::getSubregion(levelAccess, 0, 0, layer, levelAccess.getWidth(), levelAccess.getHeight(), 1), de::max(1, baseCellSize>>level), colorA, colorB);
				}
			}
			m_texture2DArray->upload();

			// Compute LOD.
			float dudx = (m_lookupSpec.maxCoord[0]-m_lookupSpec.minCoord[0])*proj*(float)m_textureSpec.width	/ (float)viewportSize[0];
			float dvdy = (m_lookupSpec.maxCoord[1]-m_lookupSpec.minCoord[1])*proj*(float)m_textureSpec.height	/ (float)viewportSize[1];
			m_lookupParams.lod = computeLodFromDerivates(DEFAULT_LOD_MODE, dudx, 0.0f, 0.0f, dvdy);

			// Append to texture list.
			m_textures.push_back(gls::TextureBinding(m_texture2DArray, m_textureSpec.sampler));
			break;
		}

		case TEXTURETYPE_3D:
		{
			float	levelStep		= isAutoLod ? 0.0f : 1.0f / (float)de::max(1, m_textureSpec.numLevels-1);
			Vec4	cScale			= fmtInfo.valueMax-fmtInfo.valueMin;
			Vec4	cBias			= fmtInfo.valueMin;
			int		baseCellSize	= de::min(de::min(m_textureSpec.width/2, m_textureSpec.height/2), m_textureSpec.depth/2);

			m_texture3D = new glu::Texture3D(m_renderCtx, m_textureSpec.format, m_textureSpec.width, m_textureSpec.height, m_textureSpec.depth);
			for (int level = 0; level < m_textureSpec.numLevels; level++)
			{
				float	fA		= (float)level*levelStep;
				float	fB		= 1.0f-fA;
				Vec4	colorA	= cBias + cScale*Vec4(fA, fB, fA, fB);
				Vec4	colorB	= cBias + cScale*Vec4(fB, fA, fB, fA);

				m_texture3D->getRefTexture().allocLevel(level);
				tcu::fillWithGrid(m_texture3D->getRefTexture().getLevel(level), de::max(1, baseCellSize>>level), colorA, colorB);
			}
			m_texture3D->upload();

			// Compute LOD.
			float dudx = (m_lookupSpec.maxCoord[0]-m_lookupSpec.minCoord[0])*proj*(float)m_textureSpec.width		/ (float)viewportSize[0];
			float dvdy = (m_lookupSpec.maxCoord[1]-m_lookupSpec.minCoord[1])*proj*(float)m_textureSpec.height		/ (float)viewportSize[1];
			float dwdx = (m_lookupSpec.maxCoord[2]-m_lookupSpec.minCoord[2])*0.5f*proj*(float)m_textureSpec.depth	/ (float)viewportSize[0];
			float dwdy = (m_lookupSpec.maxCoord[2]-m_lookupSpec.minCoord[2])*0.5f*proj*(float)m_textureSpec.depth	/ (float)viewportSize[1];
			m_lookupParams.lod = computeLodFromDerivates(DEFAULT_LOD_MODE, dudx, 0.0f, dwdx, 0.0f, dvdy, dwdy);

			// Append to texture list.
			m_textures.push_back(gls::TextureBinding(m_texture3D, m_textureSpec.sampler));
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
	}

	// Set lookup scale & bias
	m_lookupParams.scale	= fmtInfo.lookupScale;
	m_lookupParams.bias		= fmtInfo.lookupBias;
	m_lookupParams.offset	= m_lookupSpec.offset;
}